

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall MCU::zigzag(MCU *this)

{
  double *pdVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  BLOCK (*paaaadVar7) [2] [2];
  undefined1 *puVar8;
  int i;
  long lVar9;
  int j;
  long lVar10;
  int iVar11;
  BLOCK (*paaaadVar12) [2] [2];
  ulong uVar13;
  int zz [8] [8];
  ulong local_168;
  BLOCK (*local_160) [2] [2];
  BLOCK (*local_150) [2] [2];
  undefined1 local_138 [264];
  
  local_160 = this->mcu;
  lVar6 = 1;
  do {
    local_160 = local_160 + 1;
    bVar3 = subVector[lVar6].height;
    if ((ulong)bVar3 != 0) {
      bVar4 = subVector[lVar6].width;
      local_150 = local_160;
      local_168 = 0;
      do {
        if ((ulong)bVar4 != 0) {
          uVar13 = 0;
          paaaadVar12 = local_150;
          do {
            memcpy(local_138,&DAT_00106300,0x100);
            lVar9 = 0;
            puVar8 = local_138;
            do {
              lVar10 = 0;
              do {
                iVar5 = *(int *)(puVar8 + lVar10 * 4);
                iVar11 = iVar5 + 7;
                if (-1 < iVar5) {
                  iVar11 = iVar5;
                }
                *(int *)(puVar8 + lVar10 * 4) =
                     (int)this->mcu[lVar6][local_168][uVar13][iVar11 >> 3][iVar5 % 8];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 8);
              lVar9 = lVar9 + 1;
              puVar8 = puVar8 + 0x20;
            } while (lVar9 != 8);
            lVar9 = 0;
            paaaadVar7 = paaaadVar12;
            puVar8 = local_138;
            do {
              lVar10 = 0;
              do {
                uVar2 = *(undefined8 *)(puVar8 + lVar10 * 4);
                pdVar1 = (*paaaadVar7)[0][0][0] + lVar10;
                *pdVar1 = (double)(int)uVar2;
                pdVar1[1] = (double)(int)((ulong)uVar2 >> 0x20);
                lVar10 = lVar10 + 2;
              } while (lVar10 != 8);
              lVar9 = lVar9 + 1;
              puVar8 = puVar8 + 0x20;
              paaaadVar7 = (BLOCK (*) [2] [2])((*paaaadVar7)[0][0] + 1);
            } while (lVar9 != 8);
            uVar13 = uVar13 + 1;
            paaaadVar12 = (BLOCK (*) [2] [2])((*paaaadVar12)[0] + 1);
          } while (uVar13 != bVar4);
        }
        local_168 = local_168 + 1;
        local_150 = (BLOCK (*) [2] [2])(*local_150 + 1);
      } while (local_168 != bVar3);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

void zigzag() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    int zz[8][8] = {
                            { 0,  1,  5,  6, 14, 15, 27, 28},
                            { 2,  4,  7, 13, 16, 26, 29, 42},
                            { 3,  8, 12, 17, 25, 30, 41, 43},
                            { 9, 11, 18, 24, 31, 40, 44, 53},
                            {10, 19, 23, 32, 39, 45, 52, 54},
                            {20, 22, 33, 38, 46, 51, 55, 60},
                            {21, 34, 37, 47, 50, 56, 59, 61},
                            {35, 36, 48, 49, 57, 58, 62, 63}
                    };
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            zz[i][j] = mcu[id][h][w][zz[i][j] / 8][zz[i][j] % 8];
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = zz[i][j];
                        }
                    }
                }
            }
        }
    }